

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<QAbstractEventDispatcher::TimerInfoV2>::
emplace<QAbstractEventDispatcher::TimerInfoV2>
          (QPodArrayOps<QAbstractEventDispatcher::TimerInfoV2> *this,qsizetype i,TimerInfoV2 *args)

{
  TimerInfoV2 **ppTVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  rep rVar4;
  TimerId TVar5;
  TimerType TVar6;
  TimerInfoV2 *pTVar7;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0026fe38:
    rVar4 = (args->interval).__r;
    TVar5 = args->timerId;
    TVar6 = args->timerType;
    where = (GrowthPosition)
            (i == 0 &&
            (this->super_QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2>).size != 0);
    QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2>::detachAndGrow
              (&this->super_QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2>,where,1,
               (TimerInfoV2 **)0x0,(QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2> *)0x0);
    pTVar7 = createHole(this,where,i,1);
    (pTVar7->interval).__r = rVar4;
    pTVar7->timerId = TVar5;
    pTVar7->timerType = TVar6;
  }
  else {
    if (((this->super_QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2>).size == i) &&
       (pTVar7 = (this->super_QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2>).ptr,
       (pDVar3->super_QArrayData).alloc !=
       ((long)((long)pTVar7 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) +
       i)) {
      TVar5 = args->timerId;
      TVar6 = args->timerType;
      pTVar7 = pTVar7 + i;
      (pTVar7->interval).__r = (args->interval).__r;
      pTVar7->timerId = TVar5;
      pTVar7->timerType = TVar6;
    }
    else {
      if ((i != 0) ||
         (pTVar7 = (this->super_QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2>).ptr,
         (TimerInfoV2 *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
         == pTVar7)) goto LAB_0026fe38;
      TVar5 = args->timerId;
      TVar6 = args->timerType;
      pTVar7[-1].interval.__r = (args->interval).__r;
      pTVar7[-1].timerId = TVar5;
      pTVar7[-1].timerType = TVar6;
      ppTVar1 = &(this->super_QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2>).ptr;
      *ppTVar1 = *ppTVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QAbstractEventDispatcher::TimerInfoV2>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }